

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void av1_read_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r,int x_mis,int y_mis)

{
  undefined1 *puVar1;
  AV1_COMMON *cm;
  nmv_context *icdf;
  aom_cdf_prob *paVar2;
  BLOCK_SIZE bsize;
  ushort uVar3;
  ushort uVar4;
  MB_MODE_INFO *pMVar5;
  FRAME_CONTEXT *ec_ctx;
  MB_MODE_INFO *pMVar6;
  FRAME_CONTEXT *pFVar7;
  SequenceHeader *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  byte bVar38;
  int8_t iVar39;
  uint8_t uVar40;
  uint uVar41;
  int iVar42;
  MV_REF *mv;
  MV_REF *pMVar43;
  byte bVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  ulong uVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  int_mv iVar53;
  bool cfl_allowed;
  undefined1 auVar54 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar76;
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar90;
  int iVar94;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int_mv local_c4;
  ulong local_c0;
  ulong local_b8;
  FRAME_CONTEXT *local_b0;
  od_ec_dec *local_a8;
  MB_MODE_INFO *local_a0;
  MB_MODE_INFO *local_98;
  ulong local_90;
  int_mv nearestmv;
  int_mv ref_mvs [1] [2];
  int16_t inter_mode_ctx [29];
  
  local_90 = (ulong)(uint)x_mis;
  pMVar5 = *(dcb->xd).mi;
  puVar1 = &pMVar5->field_0xa7;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xff7f;
  cm = &pbi->common;
  if (((pbi->common).current_frame.frame_type & 0xfd) != 0) {
    read_inter_frame_mode_info(pbi,dcb,r);
    if ((((pbi->common).seq_params)->order_hint_info).enable_ref_frame_mvs == 0) {
      return;
    }
    av1_copy_frame_mvs(cm,pMVar5,(dcb->xd).mi_row,(dcb->xd).mi_col,x_mis,y_mis);
    return;
  }
  local_98 = (dcb->xd).left_mbmi;
  pMVar5 = *(dcb->xd).mi;
  local_a0 = (dcb->xd).above_mbmi;
  bsize = pMVar5->bsize;
  ec_ctx = (dcb->xd).tile_ctx;
  if ((pbi->common).seg.segid_preskip == '\0') {
    uVar41 = *(ushort *)&pMVar5->field_0xa7 & 7;
  }
  else {
    uVar41 = read_intra_segment_id(cm,&dcb->xd,bsize,r,0);
    uVar41 = uVar41 & 7;
    *(ushort *)&pMVar5->field_0xa7 = *(ushort *)&pMVar5->field_0xa7 & 0xfff8 | (ushort)uVar41;
  }
  uVar41 = read_skip_txfm(cm,&dcb->xd,uVar41,r);
  pMVar5->skip_txfm = (uint8_t)uVar41;
  if ((pbi->common).seg.segid_preskip == '\0') {
    iVar42 = read_intra_segment_id(cm,&dcb->xd,bsize,r,uVar41 & 0xff);
    *(ushort *)&pMVar5->field_0xa7 = *(ushort *)&pMVar5->field_0xa7 & 0xfff8 | (ushort)iVar42 & 7;
  }
  read_cdef(cm,r,&dcb->xd);
  read_delta_q_params(cm,&dcb->xd,r);
  pMVar5->current_qindex = (dcb->xd).current_base_qindex;
  pMVar5->ref_frame[0] = '\0';
  pMVar5->ref_frame[1] = -1;
  (pMVar5->palette_mode_info).palette_size[0] = '\0';
  (pMVar5->palette_mode_info).palette_size[1] = '\0';
  (pMVar5->filter_intra_mode_info).use_filter_intra = '\0';
  (dcb->xd).above_txfm_context =
       (pbi->common).above_contexts.txfm[(dcb->xd).tile.tile_row] + (dcb->xd).mi_col;
  (dcb->xd).left_txfm_context = (dcb->xd).left_txfm_context_buffer + ((dcb->xd).mi_row & 0x1f);
  if (((((pbi->common).current_frame.frame_type & 0xfd) == 0) &&
      ((pbi->common).features.allow_screen_content_tools == true)) &&
     ((pbi->common).features.allow_intrabc != false)) {
    pMVar6 = *(dcb->xd).mi;
    pFVar7 = (dcb->xd).tile_ctx;
    local_a8 = &r->ec;
    uVar41 = od_ec_decode_cdf_q15(local_a8,pFVar7->intrabc_cdf,2);
    if (r->allow_update_cdf != '\0') {
      uVar3 = pFVar7->intrabc_cdf[2];
      bVar44 = (char)(uVar3 >> 4) + 4;
      uVar4 = pFVar7->intrabc_cdf[0];
      if ((char)uVar41 < '\x01') {
        sVar30 = -(uVar4 >> (bVar44 & 0x1f));
      }
      else {
        sVar30 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar44 & 0x1f));
      }
      pFVar7->intrabc_cdf[0] = sVar30 + uVar4;
      pFVar7->intrabc_cdf[2] = uVar3 + (uVar3 < 0x20);
    }
    *(ushort *)&pMVar6->field_0xa7 =
         *(ushort *)&pMVar6->field_0xa7 & 0xff7f | (ushort)(byte)(uVar41 << 7);
    if ((uVar41 & 1) != 0) {
      uVar49 = (ulong)pMVar6->bsize;
      pMVar6->mode = '\0';
      pMVar6->uv_mode = '\0';
      (pMVar6->interp_filters).as_int = 0x30003;
      pMVar6->motion_mode = '\0';
      av1_find_mv_refs(cm,&dcb->xd,pMVar6,'\0',dcb->ref_mv_count,(dcb->xd).ref_mv_stack,
                       (dcb->xd).weight,(int_mv (*) [2])ref_mvs[0],(int_mv *)0x0,inter_mode_ctx);
      av1_find_best_ref_mvs(0,ref_mvs[0],&nearestmv,&local_c4,0);
      if (nearestmv.as_int == 0) {
        nearestmv = local_c4;
      }
      iVar53 = nearestmv;
      if (nearestmv.as_int == 0) {
        iVar42 = ((pbi->common).seq_params)->mib_size;
        iVar53.as_int = iVar42 * 0xffe0 & 0xffff;
        if ((dcb->xd).mi_row - iVar42 < (dcb->xd).tile.mi_row_start) {
          iVar53.as_int = iVar42 * -0x200000 + 0xf8000000;
        }
      }
      if (((iVar53.as_int >> 0x10 | iVar53.as_int) & 7) == 0) {
        local_b8 = (ulong)(uint)(dcb->xd).mi_row;
        local_c0 = (ulong)(uint)(dcb->xd).mi_col;
        pFVar7 = (dcb->xd).tile_ctx;
        icdf = &pFVar7->ndvc;
        iVar42 = od_ec_decode_cdf_q15(local_a8,icdf->joints_cdf,4);
        bVar44 = (byte)iVar42;
        if (r->allow_update_cdf != '\0') {
          uVar3 = (pFVar7->ndvc).joints_cdf[4];
          bVar38 = (char)(uVar3 >> 4) + 5;
          lVar48 = 0;
          do {
            uVar4 = icdf->joints_cdf[lVar48];
            if (lVar48 < (char)bVar44) {
              sVar30 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar38 & 0x1f));
            }
            else {
              sVar30 = -(uVar4 >> (bVar38 & 0x1f));
            }
            icdf->joints_cdf[lVar48] = sVar30 + uVar4;
            lVar48 = lVar48 + 1;
          } while (lVar48 != 3);
          paVar2 = (pFVar7->ndvc).joints_cdf + 4;
          *paVar2 = *paVar2 + (ushort)(uVar3 < 0x20);
        }
        local_b0 = pFVar7;
        if ((bVar44 & 0xfe) == 2) {
          iVar42 = read_mv_component(r,(pFVar7->ndvc).comps,0,0);
        }
        else {
          iVar42 = 0;
        }
        if ((bVar44 & 0xfd) == 1) {
          iVar45 = read_mv_component(r,(local_b0->ndvc).comps + 1,0,0);
        }
        else {
          iVar45 = 0;
        }
        uVar41 = iVar45 + (iVar53.as_int >> 0x10 & 0xfffffff8) & 0xfff8;
        pMVar6->mv[0].as_mv.col = (int16_t)uVar41;
        uVar52 = iVar42 + (iVar53.as_int & 0xfff8) & 0xfff8;
        pMVar6->mv[0].as_mv.row = (int16_t)uVar52;
        if (((0x8000 < (uVar52 - 0x4000 & 0xffff)) && (0x8000 < (uVar41 - 0x4000 & 0xffff))) &&
           ((uVar41 = pMVar6->mv[0].as_int, (uVar41 & 7) == 0 && ((uVar41 & 0x70000) == 0)))) {
          iVar42 = (int)local_b8 * 0x20 + (int)(short)uVar41;
          iVar45 = (dcb->xd).tile.mi_row_start * 0x20;
          if (iVar45 <= iVar42) {
            iVar46 = (int)local_c0 * 0x20 + ((int)uVar41 >> 0x10);
            uVar41 = (dcb->xd).tile.mi_col_start;
            iVar51 = uVar41 * 0x20;
            if ((iVar51 <= iVar46) &&
               (iVar47 = iVar42 + (uint)block_size_high[uVar49] * 8,
               iVar47 <= (dcb->xd).tile.mi_row_end * 0x20)) {
              iVar50 = iVar46 + (uint)block_size_wide[uVar49] * 8;
              iVar76 = (dcb->xd).tile.mi_col_end;
              if (iVar50 <= iVar76 * 0x20) {
                pSVar8 = (pbi->common).seq_params;
                if ((((dcb->xd).is_chroma_ref != true) || (pSVar8->monochrome != '\0')) ||
                   ((((0x10003UL >> (uVar49 & 0x3f) & 1) == 0 ||
                     (((dcb->xd).plane[1].subsampling_x == 0 || (iVar51 + 0x20 <= iVar46)))) &&
                    (((0x20005UL >> (uVar49 & 0x3f) & 1) == 0 ||
                     (((dcb->xd).plane[1].subsampling_y == 0 || (iVar45 + 0x20 <= iVar42)))))))) {
                  bVar44 = (byte)pSVar8->mib_size_log2;
                  iVar46 = (int)local_b8 >> (bVar44 & 0x1f);
                  iVar45 = 4 << (bVar44 & 0x1f);
                  iVar42 = ((iVar47 >> 3) + -1) / iVar45;
                  if (iVar42 <= iVar46) {
                    iVar51 = (int)local_c0 >> 4;
                    iVar47 = (iVar50 >> 3) + -1 >> 6;
                    iVar50 = ((int)(iVar76 + ~uVar41) >> 4) + 1;
                    if ((iVar42 * iVar50 + iVar47 < iVar51 + iVar46 * iVar50 + -4) &&
                       (iVar47 < (int)((iVar46 - iVar42) * ((0x40 < iVar45) + 5) + iVar51 + -4)))
                    goto LAB_00181298;
                  }
                }
              }
            }
          }
        }
      }
      aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid intrabc dv");
    }
LAB_00181298:
    if ((pMVar5->field_0xa7 & 0x80) != 0) goto LAB_00181422;
  }
  bVar44 = av1_above_block_mode(local_a0);
  bVar38 = av1_left_block_mode(local_98);
  bVar44 = read_intra_mode(r,ec_ctx->kf_y_cdf[intra_mode_context[bVar44]]
                             [intra_mode_context[bVar38]]);
  pMVar5->mode = bVar44;
  iVar39 = '\0';
  if ((BLOCK_8X4 < bsize) && (iVar39 = '\0', 0xf7 < (byte)(bVar44 - 9))) {
    iVar42 = read_angle_delta(r,ec_ctx->angle_delta_cdf[(ulong)bVar44 - 1]);
    iVar39 = (int8_t)iVar42;
  }
  pMVar5->angle_delta[0] = iVar39;
  uVar40 = ((pbi->common).seq_params)->monochrome;
  if ((uVar40 == '\0') && ((dcb->xd).is_chroma_ref == true)) {
    pMVar6 = *(dcb->xd).mi;
    uVar49 = (ulong)pMVar6->bsize;
    if ((dcb->xd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
      cfl_allowed = (0x2f0bffUL >> (uVar49 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar49 & 0x3f) & 1) == 0) {
        cfl_allowed = false;
      }
    }
    else {
      cfl_allowed = av1_ss_size_lookup[uVar49][(dcb->xd).plane[1].subsampling_x]
                    [(dcb->xd).plane[1].subsampling_y] == BLOCK_4X4;
    }
    bVar44 = read_intra_mode_uv(ec_ctx,r,cfl_allowed,pMVar5->mode);
    pMVar5->uv_mode = bVar44;
    if (bVar44 == 0xd) {
      uVar40 = read_cfl_alphas(ec_ctx,r,&pMVar5->cfl_alpha_signs);
      pMVar5->cfl_alpha_idx = uVar40;
      bVar44 = pMVar5->uv_mode;
    }
    iVar39 = '\0';
    if ((BLOCK_8X4 < bsize) && (iVar39 = '\0', 0xf7 < (byte)(get_uv_mode_uv2y[bVar44] - 9))) {
      iVar42 = read_angle_delta(r,ec_ctx->angle_delta_cdf[(ulong)(byte)get_uv_mode_uv2y[bVar44] - 1]
                               );
      iVar39 = (int8_t)iVar42;
    }
    pMVar5->angle_delta[1] = iVar39;
    uVar40 = ((pbi->common).seq_params)->monochrome;
  }
  else {
    pMVar5->uv_mode = '\0';
  }
  if (uVar40 == '\0') {
    uVar41 = 1;
    if ((dcb->xd).is_chroma_ref == true) {
      pMVar5 = *(dcb->xd).mi;
      if ((pMVar5->field_0xa7 & 0x80) != 0) goto LAB_001813b2;
      uVar41 = 0;
      if (pMVar5->ref_frame[0] < '\x01') {
        uVar41 = (uint)(pMVar5->uv_mode == '\r');
      }
    }
  }
  else {
LAB_001813b2:
    uVar41 = 0;
  }
  (dcb->xd).cfl.store_y = uVar41;
  if (((pbi->common).features.allow_screen_content_tools != false) &&
     ((0xf < bsize || ((0xe007U >> (bsize & 0x1f) & 1) == 0)))) {
    read_palette_mode_info(cm,&dcb->xd,r);
  }
  read_filter_intra_mode_info(cm,&dcb->xd,r);
LAB_00181422:
  auVar37 = _DAT_004d4dc0;
  auVar36 = _DAT_004d4db0;
  auVar35 = _DAT_004d2f50;
  auVar34 = _DAT_004d2f40;
  auVar33 = _DAT_004d09d0;
  auVar32 = _DAT_004d09c0;
  auVar31 = _DAT_004d09b0;
  if (((((pbi->common).seq_params)->order_hint_info).enable_ref_frame_mvs != 0) &&
     (iVar42 = y_mis + 1 >> 1, 0 < iVar42)) {
    uVar41 = (int)local_90 + 1 >> 1;
    iVar45 = (pbi->common).mi_params.mi_cols + 1 >> 1;
    pMVar43 = ((pbi->common).cur_frame)->mvs +
              (long)(((dcb->xd).mi_row >> 1) * iVar45) + (long)((dcb->xd).mi_col >> 1);
    lVar48 = (ulong)uVar41 - 1;
    auVar54._8_4_ = (int)lVar48;
    auVar54._0_8_ = lVar48;
    auVar54._12_4_ = (int)((ulong)lVar48 >> 0x20);
    iVar46 = 0;
    do {
      if (0 < (int)uVar41) {
        uVar49 = 0;
        do {
          auVar72._8_4_ = (int)uVar49;
          auVar72._0_8_ = uVar49;
          auVar72._12_4_ = (int)(uVar49 >> 0x20);
          auVar74 = auVar54 ^ auVar33;
          auVar77 = (auVar72 | auVar32) ^ auVar33;
          iVar51 = auVar74._0_4_;
          iVar90 = -(uint)(iVar51 < auVar77._0_4_);
          iVar47 = auVar74._4_4_;
          auVar79._4_4_ = -(uint)(iVar47 < auVar77._4_4_);
          iVar50 = auVar74._8_4_;
          iVar94 = -(uint)(iVar50 < auVar77._8_4_);
          iVar76 = auVar74._12_4_;
          auVar79._12_4_ = -(uint)(iVar76 < auVar77._12_4_);
          auVar55._4_4_ = iVar90;
          auVar55._0_4_ = iVar90;
          auVar55._8_4_ = iVar94;
          auVar55._12_4_ = iVar94;
          auVar55 = pshuflw(in_XMM1,auVar55,0xe8);
          auVar78._4_4_ = -(uint)(auVar77._4_4_ == iVar47);
          auVar78._12_4_ = -(uint)(auVar77._12_4_ == iVar76);
          auVar78._0_4_ = auVar78._4_4_;
          auVar78._8_4_ = auVar78._12_4_;
          auVar64 = pshuflw(in_XMM2,auVar78,0xe8);
          auVar79._0_4_ = auVar79._4_4_;
          auVar79._8_4_ = auVar79._12_4_;
          auVar77 = pshuflw(auVar55,auVar79,0xe8);
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          auVar74 = (auVar77 | auVar64 & auVar55) ^ auVar74;
          auVar74 = packssdw(auVar74,auVar74);
          if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pMVar43[uVar49].ref_frame = -1;
          }
          auVar64._4_4_ = iVar90;
          auVar64._0_4_ = iVar90;
          auVar64._8_4_ = iVar94;
          auVar64._12_4_ = iVar94;
          auVar79 = auVar78 & auVar64 | auVar79;
          auVar74 = packssdw(auVar79,auVar79);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar77,auVar74 ^ auVar77);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._0_4_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 1].ref_frame = -1;
          }
          auVar74 = (auVar72 | auVar31) ^ auVar33;
          auVar65._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar65._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar65._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar65._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar80._4_4_ = auVar65._0_4_;
          auVar80._0_4_ = auVar65._0_4_;
          auVar80._8_4_ = auVar65._8_4_;
          auVar80._12_4_ = auVar65._8_4_;
          iVar90 = -(uint)(auVar74._4_4_ == iVar47);
          iVar94 = -(uint)(auVar74._12_4_ == iVar76);
          auVar18._4_4_ = iVar90;
          auVar18._0_4_ = iVar90;
          auVar18._8_4_ = iVar94;
          auVar18._12_4_ = iVar94;
          auVar91._4_4_ = auVar65._4_4_;
          auVar91._0_4_ = auVar65._4_4_;
          auVar91._8_4_ = auVar65._12_4_;
          auVar91._12_4_ = auVar65._12_4_;
          auVar74 = auVar18 & auVar80 | auVar91;
          auVar74 = packssdw(auVar74,auVar74);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar9,auVar74 ^ auVar9);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
            pMVar43[uVar49 + 2].ref_frame = -1;
          }
          auVar74 = pshufhw(auVar74,auVar80,0x84);
          auVar19._4_4_ = iVar90;
          auVar19._0_4_ = iVar90;
          auVar19._8_4_ = iVar94;
          auVar19._12_4_ = iVar94;
          auVar77 = pshufhw(auVar65,auVar19,0x84);
          auVar55 = pshufhw(auVar74,auVar91,0x84);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar55 | auVar77 & auVar74) ^ auVar56;
          auVar74 = packssdw(auVar56,auVar56);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._0_4_ >> 0x18 & 1) != 0) {
            pMVar43[uVar49 + 3].ref_frame = -1;
          }
          auVar74 = (auVar72 | auVar35) ^ auVar33;
          auVar66._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar66._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar66._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar66._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar20._4_4_ = auVar66._0_4_;
          auVar20._0_4_ = auVar66._0_4_;
          auVar20._8_4_ = auVar66._8_4_;
          auVar20._12_4_ = auVar66._8_4_;
          auVar77 = pshuflw(auVar91,auVar20,0xe8);
          auVar57._0_4_ = -(uint)(auVar74._0_4_ == iVar51);
          auVar57._4_4_ = -(uint)(auVar74._4_4_ == iVar47);
          auVar57._8_4_ = -(uint)(auVar74._8_4_ == iVar50);
          auVar57._12_4_ = -(uint)(auVar74._12_4_ == iVar76);
          auVar81._4_4_ = auVar57._4_4_;
          auVar81._0_4_ = auVar57._4_4_;
          auVar81._8_4_ = auVar57._12_4_;
          auVar81._12_4_ = auVar57._12_4_;
          auVar74 = pshuflw(auVar57,auVar81,0xe8);
          auVar82._4_4_ = auVar66._4_4_;
          auVar82._0_4_ = auVar66._4_4_;
          auVar82._8_4_ = auVar66._12_4_;
          auVar82._12_4_ = auVar66._12_4_;
          auVar55 = pshuflw(auVar66,auVar82,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 & auVar77,(auVar55 | auVar74 & auVar77) ^ auVar10);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pMVar43[uVar49 + 4].ref_frame = -1;
          }
          auVar21._4_4_ = auVar66._0_4_;
          auVar21._0_4_ = auVar66._0_4_;
          auVar21._8_4_ = auVar66._8_4_;
          auVar21._12_4_ = auVar66._8_4_;
          auVar82 = auVar81 & auVar21 | auVar82;
          auVar55 = packssdw(auVar82,auVar82);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74,auVar55 ^ auVar11);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._4_2_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 5].ref_frame = -1;
          }
          auVar74 = (auVar72 | auVar34) ^ auVar33;
          auVar67._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar67._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar67._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar67._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar83._4_4_ = auVar67._0_4_;
          auVar83._0_4_ = auVar67._0_4_;
          auVar83._8_4_ = auVar67._8_4_;
          auVar83._12_4_ = auVar67._8_4_;
          iVar90 = -(uint)(auVar74._4_4_ == iVar47);
          iVar94 = -(uint)(auVar74._12_4_ == iVar76);
          auVar22._4_4_ = iVar90;
          auVar22._0_4_ = iVar90;
          auVar22._8_4_ = iVar94;
          auVar22._12_4_ = iVar94;
          auVar92._4_4_ = auVar67._4_4_;
          auVar92._0_4_ = auVar67._4_4_;
          auVar92._8_4_ = auVar67._12_4_;
          auVar92._12_4_ = auVar67._12_4_;
          auVar74 = auVar22 & auVar83 | auVar92;
          auVar74 = packssdw(auVar74,auVar74);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar12,auVar74 ^ auVar12);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pMVar43[uVar49 + 6].ref_frame = -1;
          }
          auVar74 = pshufhw(auVar74,auVar83,0x84);
          auVar23._4_4_ = iVar90;
          auVar23._0_4_ = iVar90;
          auVar23._8_4_ = iVar94;
          auVar23._12_4_ = iVar94;
          auVar77 = pshufhw(auVar67,auVar23,0x84);
          auVar55 = pshufhw(auVar74,auVar92,0x84);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar55 | auVar77 & auVar74) ^ auVar58;
          auVar74 = packssdw(auVar58,auVar58);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._6_2_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 7].ref_frame = -1;
          }
          auVar74 = (auVar72 | auVar37) ^ auVar33;
          auVar68._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar68._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar68._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar68._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar24._4_4_ = auVar68._0_4_;
          auVar24._0_4_ = auVar68._0_4_;
          auVar24._8_4_ = auVar68._8_4_;
          auVar24._12_4_ = auVar68._8_4_;
          auVar77 = pshuflw(auVar92,auVar24,0xe8);
          auVar59._0_4_ = -(uint)(auVar74._0_4_ == iVar51);
          auVar59._4_4_ = -(uint)(auVar74._4_4_ == iVar47);
          auVar59._8_4_ = -(uint)(auVar74._8_4_ == iVar50);
          auVar59._12_4_ = -(uint)(auVar74._12_4_ == iVar76);
          auVar84._4_4_ = auVar59._4_4_;
          auVar84._0_4_ = auVar59._4_4_;
          auVar84._8_4_ = auVar59._12_4_;
          auVar84._12_4_ = auVar59._12_4_;
          auVar74 = pshuflw(auVar59,auVar84,0xe8);
          auVar85._4_4_ = auVar68._4_4_;
          auVar85._0_4_ = auVar68._4_4_;
          auVar85._8_4_ = auVar68._12_4_;
          auVar85._12_4_ = auVar68._12_4_;
          auVar55 = pshuflw(auVar68,auVar85,0xe8);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar69 = (auVar55 | auVar74 & auVar77) ^ auVar69;
          auVar55 = packssdw(auVar69,auVar69);
          auVar74 = packsswb(auVar74 & auVar77,auVar55);
          if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pMVar43[uVar49 + 8].ref_frame = -1;
          }
          auVar25._4_4_ = auVar68._0_4_;
          auVar25._0_4_ = auVar68._0_4_;
          auVar25._8_4_ = auVar68._8_4_;
          auVar25._12_4_ = auVar68._8_4_;
          auVar85 = auVar84 & auVar25 | auVar85;
          auVar55 = packssdw(auVar85,auVar85);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar13,auVar55 ^ auVar13);
          auVar74 = packsswb(auVar74,auVar55);
          if ((auVar74._8_2_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 9].ref_frame = -1;
          }
          auVar74 = (auVar72 | auVar36) ^ auVar33;
          auVar70._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar70._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar70._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar70._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar86._4_4_ = auVar70._0_4_;
          auVar86._0_4_ = auVar70._0_4_;
          auVar86._8_4_ = auVar70._8_4_;
          auVar86._12_4_ = auVar70._8_4_;
          iVar90 = -(uint)(auVar74._4_4_ == iVar47);
          iVar94 = -(uint)(auVar74._12_4_ == iVar76);
          auVar26._4_4_ = iVar90;
          auVar26._0_4_ = iVar90;
          auVar26._8_4_ = iVar94;
          auVar26._12_4_ = iVar94;
          auVar93._4_4_ = auVar70._4_4_;
          auVar93._0_4_ = auVar70._4_4_;
          auVar93._8_4_ = auVar70._12_4_;
          auVar93._12_4_ = auVar70._12_4_;
          auVar74 = auVar26 & auVar86 | auVar93;
          auVar74 = packssdw(auVar74,auVar74);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar14,auVar74 ^ auVar14);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pMVar43[uVar49 + 10].ref_frame = -1;
          }
          auVar74 = pshufhw(auVar74,auVar86,0x84);
          auVar27._4_4_ = iVar90;
          auVar27._0_4_ = iVar90;
          auVar27._8_4_ = iVar94;
          auVar27._12_4_ = iVar94;
          auVar77 = pshufhw(auVar70,auVar27,0x84);
          auVar55 = pshufhw(auVar74,auVar93,0x84);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar60 = (auVar55 | auVar77 & auVar74) ^ auVar60;
          auVar74 = packssdw(auVar60,auVar60);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._10_2_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 0xb].ref_frame = -1;
          }
          auVar74 = (auVar72 | _DAT_004d4da0) ^ auVar33;
          auVar71._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar71._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar71._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar71._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar28._4_4_ = auVar71._0_4_;
          auVar28._0_4_ = auVar71._0_4_;
          auVar28._8_4_ = auVar71._8_4_;
          auVar28._12_4_ = auVar71._8_4_;
          auVar77 = pshuflw(auVar93,auVar28,0xe8);
          auVar61._0_4_ = -(uint)(auVar74._0_4_ == iVar51);
          auVar61._4_4_ = -(uint)(auVar74._4_4_ == iVar47);
          auVar61._8_4_ = -(uint)(auVar74._8_4_ == iVar50);
          auVar61._12_4_ = -(uint)(auVar74._12_4_ == iVar76);
          auVar87._4_4_ = auVar61._4_4_;
          auVar87._0_4_ = auVar61._4_4_;
          auVar87._8_4_ = auVar61._12_4_;
          auVar87._12_4_ = auVar61._12_4_;
          auVar74 = pshuflw(auVar61,auVar87,0xe8);
          auVar88._4_4_ = auVar71._4_4_;
          auVar88._0_4_ = auVar71._4_4_;
          auVar88._8_4_ = auVar71._12_4_;
          auVar88._12_4_ = auVar71._12_4_;
          auVar55 = pshuflw(auVar71,auVar88,0xe8);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 & auVar77,(auVar55 | auVar74 & auVar77) ^ auVar15);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pMVar43[uVar49 + 0xc].ref_frame = -1;
          }
          auVar29._4_4_ = auVar71._0_4_;
          auVar29._0_4_ = auVar71._0_4_;
          auVar29._8_4_ = auVar71._8_4_;
          auVar29._12_4_ = auVar71._8_4_;
          auVar88 = auVar87 & auVar29 | auVar88;
          auVar55 = packssdw(auVar88,auVar88);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74,auVar55 ^ auVar16);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74._12_2_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 0xd].ref_frame = -1;
          }
          auVar74 = (auVar72 | _DAT_004d4d90) ^ auVar33;
          auVar62._0_4_ = -(uint)(iVar51 < auVar74._0_4_);
          auVar62._4_4_ = -(uint)(iVar47 < auVar74._4_4_);
          auVar62._8_4_ = -(uint)(iVar50 < auVar74._8_4_);
          auVar62._12_4_ = -(uint)(iVar76 < auVar74._12_4_);
          auVar89._4_4_ = auVar62._0_4_;
          auVar89._0_4_ = auVar62._0_4_;
          auVar89._8_4_ = auVar62._8_4_;
          auVar89._12_4_ = auVar62._8_4_;
          auVar73._4_4_ = -(uint)(auVar74._4_4_ == iVar47);
          auVar73._12_4_ = -(uint)(auVar74._12_4_ == iVar76);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar75._4_4_ = auVar62._4_4_;
          auVar75._0_4_ = auVar62._4_4_;
          auVar75._8_4_ = auVar62._12_4_;
          auVar75._12_4_ = auVar62._12_4_;
          auVar55 = auVar73 & auVar89 | auVar75;
          auVar74 = packssdw(auVar62,auVar55);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar17,auVar74 ^ auVar17);
          auVar74 = packsswb(auVar74,auVar74);
          if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pMVar43[uVar49 + 0xe].ref_frame = -1;
          }
          auVar74 = pshufhw(auVar74,auVar89,0x84);
          in_XMM2 = pshufhw(auVar55,auVar73,0x84);
          in_XMM2 = in_XMM2 & auVar74;
          auVar74 = pshufhw(auVar74,auVar75,0x84);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar74 | in_XMM2) ^ auVar63;
          auVar74 = packssdw(auVar63,auVar63);
          in_XMM1 = packsswb(auVar74,auVar74);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            pMVar43[uVar49 + 0xf].ref_frame = -1;
          }
          uVar49 = uVar49 + 0x10;
        } while ((uVar41 + 0xf & 0xfffffff0) != uVar49);
      }
      iVar46 = iVar46 + 1;
      pMVar43 = pMVar43 + iVar45;
    } while (iVar46 != iVar42);
  }
  return;
}

Assistant:

void av1_read_mode_info(AV1Decoder *const pbi, DecoderCodingBlock *dcb,
                        aom_reader *r, int x_mis, int y_mis) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mi = xd->mi[0];
  mi->use_intrabc = 0;

  if (frame_is_intra_only(cm)) {
    read_intra_frame_mode_info(cm, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      intra_copy_frame_mvs(cm, xd->mi_row, xd->mi_col, x_mis, y_mis);
  } else {
    read_inter_frame_mode_info(pbi, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      av1_copy_frame_mvs(cm, mi, xd->mi_row, xd->mi_col, x_mis, y_mis);
  }
}